

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 150_evaluateReversePolishNums.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  vector<int,_std::allocator<int>_> adj [8010];
  int local_10c;
  _Vector_base<int,_std::allocator<int>_> local_108 [10];
  
  memset(local_108,0,0xf0);
  for (local_10c = 0; local_10c < 10; local_10c = local_10c + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)(local_108 + local_10c),&local_10c);
  }
  lVar1 = 0xd8;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)
               ((long)&local_108[0]._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return 0;
}

Assistant:

int main()
{
	// string s1 = "+";
	// if (s1=="+")
	// 	cout<<"TTT"<<endl;
	// vector<string> v = {"9","10","2"};
	// sort(v.begin(),v.end());
	// for (auto s : v)
	// 	cout<<s;
	int n = 10;
	vector<int> adj[n];
	for (int i=0;i<n;i++)
	{
		adj[i].push_back(i);
	}

	// cout<<stoi(s1)<<endl;
}